

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

bool __thiscall FConsoleCommand::AddToHash(FConsoleCommand *this,FConsoleCommand **table)

{
  char *s;
  uint uVar1;
  size_t namelen;
  FConsoleCommand *pFVar2;
  FConsoleCommand **ppFVar3;
  FConsoleCommand *pFVar4;
  FConsoleCommand *insert;
  FConsoleCommand *local_30;
  
  s = this->m_Name;
  uVar1 = MakeKey(s);
  pFVar2 = table[(ulong)uVar1 % 0xfb];
  namelen = strlen(s);
  pFVar2 = ScanChainForName(pFVar2,s,namelen,&local_30);
  if (pFVar2 == (FConsoleCommand *)0x0) {
    if (local_30 == (FConsoleCommand *)0x0) {
      ppFVar3 = table + (ulong)uVar1 % 0xfb;
      this->m_Next = *ppFVar3;
      *ppFVar3 = this;
      this->m_Prev = ppFVar3;
      pFVar4 = this->m_Next;
      if (pFVar4 == (FConsoleCommand *)0x0) goto LAB_0042af1e;
      ppFVar3 = &this->m_Next;
    }
    else {
      pFVar4 = local_30->m_Next;
      ppFVar3 = &local_30->m_Next;
      this->m_Next = pFVar4;
      if (pFVar4 != (FConsoleCommand *)0x0) {
        pFVar4->m_Prev = &this->m_Next;
      }
      *ppFVar3 = this;
      pFVar4 = this;
    }
    pFVar4->m_Prev = ppFVar3;
  }
LAB_0042af1e:
  return pFVar2 == (FConsoleCommand *)0x0;
}

Assistant:

bool FConsoleCommand::AddToHash (FConsoleCommand **table)
{
	unsigned int key;
	FConsoleCommand *insert, **bucket;

	key = MakeKey (m_Name);
	bucket = &table[key % HASH_SIZE];

	if (ScanChainForName (*bucket, m_Name, strlen (m_Name), &insert))
	{
		return false;
	}
	else
	{
		if (insert)
		{
			m_Next = insert->m_Next;
			if (m_Next)
				m_Next->m_Prev = &m_Next;
			insert->m_Next = this;
			m_Prev = &insert->m_Next;
		}
		else
		{
			m_Next = *bucket;
			*bucket = this;
			m_Prev = bucket;
			if (m_Next)
				m_Next->m_Prev = &m_Next;
		}
	}
	return true;
}